

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

int classmon(char *plch,boolean fem)

{
  int iVar1;
  int local_20;
  int i;
  boolean fem_local;
  char *plch_local;
  
  local_20 = 0;
  while( true ) {
    if (roles[local_20].name.m == (char *)0x0) {
      warning("What weird role is this? (%s)",plch);
      return 0xc6;
    }
    iVar1 = strncmp(plch,roles[local_20].filecode,3);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  if ((fem != '\0') && (roles[local_20].femalenum != -1)) {
    return (int)roles[local_20].femalenum;
  }
  if (roles[local_20].malenum != -1) {
    return (int)roles[local_20].malenum;
  }
  return 0x10b;
}

Assistant:

static int classmon(char *plch, boolean fem)
{
    int i;

    /* Look for this role in the role table */
    for (i = 0; roles[i].name.m; i++)
	if (!strncmp(plch, roles[i].filecode, ROLESZ)) {
	    if (fem && roles[i].femalenum != NON_PM)
		return roles[i].femalenum;
	    else if (roles[i].malenum != NON_PM)
		return roles[i].malenum;
	    else
		return PM_HUMAN;
	}

    warning("What weird role is this? (%s)", plch);
    return PM_HUMAN_MUMMY;
}